

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::addFollowing
          (BreakCache *this,int32_t position,int32_t ruleStatusIdx,UpdatePositionValues update)

{
  uint uVar1;
  
  uVar1 = this->fEndBufIdx + 1U & 0x7f;
  if (uVar1 == this->fStartBufIdx) {
    this->fStartBufIdx = this->fEndBufIdx + 7U & 0x7f;
  }
  this->fBoundaries[uVar1] = position;
  this->fStatuses[uVar1] = (uint16_t)ruleStatusIdx;
  this->fEndBufIdx = uVar1;
  if (update == UpdateCachePosition) {
    this->fBufIdx = uVar1;
    this->fTextIdx = position;
  }
  return;
}

Assistant:

void RuleBasedBreakIterator::BreakCache::addFollowing(int32_t position, int32_t ruleStatusIdx, UpdatePositionValues update) {
    U_ASSERT(position > fBoundaries[fEndBufIdx]);
    U_ASSERT(ruleStatusIdx <= UINT16_MAX);
    int32_t nextIdx = modChunkSize(fEndBufIdx + 1);
    if (nextIdx == fStartBufIdx) {
        fStartBufIdx = modChunkSize(fStartBufIdx + 6);    // TODO: experiment. Probably revert to 1.
    }
    fBoundaries[nextIdx] = position;
    fStatuses[nextIdx] = static_cast<uint16_t>(ruleStatusIdx);
    fEndBufIdx = nextIdx;
    if (update == UpdateCachePosition) {
        // Set current position to the newly added boundary.
        fBufIdx = nextIdx;
        fTextIdx = position;
    } else {
        // Retaining the original cache position.
        // Check if the added boundary wraps around the buffer, and would over-write the original position.
        // It's the responsibility of callers of this function to not add too many.
        U_ASSERT(nextIdx != fBufIdx);
    }
}